

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void update_call_mem_live(gen_ctx_t gen_ctx,bitmap_t mem_live,MIR_insn_t call_insn)

{
  MIR_item_t pMVar1;
  size_t sVar2;
  mem_attr_t *pmVar3;
  ulong uVar4;
  char *pcVar5;
  
  if ((int)*(ulong *)&call_insn->field_0x18 - 0xaaU < 0xfffffffd) {
    __assert_fail("MIR_call_code_p (call_insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1366,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
  }
  if ((call_insn->ops[0].field_0x8 == '\b') &&
     (pMVar1 = call_insn->ops[0].u.ref, pMVar1->item_type == MIR_proto_item)) {
    if (gen_ctx->full_escape_p == '\0') {
      uVar4 = (ulong)(((pMVar1->u).proto)->nres + 1);
      pcVar5 = &call_insn->ops[uVar4].field_0x8;
      while( true ) {
        if (*(ulong *)&call_insn->field_0x18 >> 0x20 <= uVar4) {
          pmVar3 = VARR_mem_attr_taddr(gen_ctx->mem_attrs);
          uVar4 = 1;
          while( true ) {
            pmVar3 = pmVar3 + 1;
            sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
            if (sVar2 <= uVar4) break;
            if (pmVar3->alloca_flag == '\0') {
              bitmap_set_bit_p(mem_live,uVar4);
            }
            uVar4 = uVar4 + 1;
          }
          return;
        }
        if ((((*pcVar5 == '\v') || (*pcVar5 == '\x02')) && (*(long *)(pcVar5 + -8) != 0)) &&
           ((*(byte *)(*(long *)(*(long *)(pcVar5 + -8) + 8) + 9) & 3) != 0)) break;
        uVar4 = uVar4 + 1;
        pcVar5 = pcVar5 + 0x30;
      }
    }
    sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
    bitmap_set_bit_range_p(mem_live,1,sVar2);
    return;
  }
  __assert_fail("call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1368,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
}

Assistant:

static void update_call_mem_live (gen_ctx_t gen_ctx, bitmap_t mem_live, MIR_insn_t call_insn) {
  gen_assert (MIR_call_code_p (call_insn->code));
  gen_assert (call_insn->ops[0].mode == MIR_OP_REF
              && call_insn->ops[0].u.ref->item_type == MIR_proto_item);
  if (full_escape_p || alloca_arg_p (gen_ctx, call_insn)) {
    bitmap_set_bit_range_p (mem_live, 1, VARR_LENGTH (mem_attr_t, mem_attrs));
  } else {
    mem_attr_t *mem_attr_addr = VARR_ADDR (mem_attr_t, mem_attrs);

    for (size_t i = 1; i < VARR_LENGTH (mem_attr_t, mem_attrs); i++)
      if (!mem_attr_addr[i].alloca_flag) bitmap_set_bit_p (mem_live, i);
  }
}